

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

bool tinyformat::detail::parseWidthOrPrecision
               (int *n,char **c,bool positionalMode,FormatArg *args,int *argIndex,int numArgs)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  runtime_error *prVar4;
  ulong uVar5;
  char cVar6;
  long in_FS_OFFSET;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = *c;
  cVar6 = *pcVar3;
  if ((byte)(cVar6 - 0x30U) < 10) {
    iVar2 = 0;
    if ((byte)(cVar6 - 0x30U) < 10) {
      iVar2 = 0;
      do {
        pcVar3 = pcVar3 + 1;
        iVar2 = (uint)(byte)(cVar6 - 0x30) + iVar2 * 10;
        *c = pcVar3;
        cVar6 = *pcVar3;
      } while ((byte)(cVar6 - 0x30U) < 10);
    }
    *n = iVar2;
LAB_0010e935:
    bVar1 = true;
  }
  else {
    if (cVar6 == '*') {
      *c = pcVar3 + 1;
      *n = 0;
      if (positionalMode) {
        cVar6 = pcVar3[1];
        uVar5 = 0;
        if ((byte)(cVar6 - 0x30U) < 10) {
          pcVar3 = pcVar3 + 2;
          uVar5 = 0;
          do {
            uVar5 = (ulong)((uint)(byte)(cVar6 - 0x30) + (int)uVar5 * 10);
            *c = pcVar3;
            cVar6 = *pcVar3;
            pcVar3 = pcVar3 + 1;
          } while ((byte)(cVar6 - 0x30U) < 10);
        }
        if (**c != '$') {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_48[0] = local_38;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_48,
                     "tinyformat: Non-positional argument used after a positional one","");
          std::runtime_error::runtime_error(prVar4,(string *)local_48);
          *(undefined ***)prVar4 = &PTR__runtime_error_001caab8;
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            __cxa_throw(prVar4,&format_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_0010ebc1;
        }
        if (((int)uVar5 < 1) || (numArgs < (int)uVar5)) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_48[0] = local_38;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_48,"tinyformat: Positional argument out of range","");
          std::runtime_error::runtime_error(prVar4,(string *)local_48);
          *(undefined ***)prVar4 = &PTR__runtime_error_001caab8;
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            __cxa_throw(prVar4,&format_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_0010ebc1;
        }
        iVar2 = FormatArg::toInt(args + (uVar5 - 1));
        *n = iVar2;
        *c = *c + 1;
      }
      else {
        iVar2 = *argIndex;
        if (numArgs <= iVar2) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_48[0] = local_38;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_48,
                     "tinyformat: Not enough arguments to read variable width or precision","");
          std::runtime_error::runtime_error(prVar4,(string *)local_48);
          *(undefined ***)prVar4 = &PTR__runtime_error_001caab8;
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            __cxa_throw(prVar4,&format_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_0010ebc1;
        }
        *argIndex = iVar2 + 1;
        iVar2 = FormatArg::toInt(args + iVar2);
        *n = iVar2;
      }
      goto LAB_0010e935;
    }
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
LAB_0010ebc1:
  __stack_chk_fail();
}

Assistant:

inline bool parseWidthOrPrecision(int& n, const char*& c, bool positionalMode,
                                  const detail::FormatArg* args,
                                  int& argIndex, int numArgs)
{
    if (*c >= '0' && *c <= '9') {
        n = parseIntAndAdvance(c);
    }
    else if (*c == '*') {
        ++c;
        n = 0;
        if (positionalMode) {
            int pos = parseIntAndAdvance(c) - 1;
            if (*c != '$')
                TINYFORMAT_ERROR("tinyformat: Non-positional argument used after a positional one");
            if (pos >= 0 && pos < numArgs)
                n = args[pos].toInt();
            else
                TINYFORMAT_ERROR("tinyformat: Positional argument out of range");
            ++c;
        }
        else {
            if (argIndex < numArgs)
                n = args[argIndex++].toInt();
            else
                TINYFORMAT_ERROR("tinyformat: Not enough arguments to read variable width or precision");
        }
    }
    else {
        return false;
    }
    return true;
}